

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChEllipsoidShape.cpp
# Opt level: O2

void __thiscall chrono::ChEllipsoidShape::ArchiveOUT(ChEllipsoidShape *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::geometry::ChEllipsoid> local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChEllipsoidShape>(marchive);
  ChVisualShape::ArchiveOUT(&this->super_ChVisualShape,marchive);
  local_28._value = &this->gellipsoid;
  local_28._name = "gellipsoid";
  local_28._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_28);
  return;
}

Assistant:

void ChEllipsoidShape::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChEllipsoidShape>();
    // serialize parent class
    ChVisualShape::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(gellipsoid);
}